

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::checkUniforms(Uniforms *this,string *_vert_src,string *_frag_src)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  char *pcVar4;
  bool local_a1;
  bool present;
  undefined1 local_70 [8];
  string arrayName;
  string name;
  _Self local_28;
  iterator it;
  string *_frag_src_local;
  string *_vert_src_local;
  Uniforms *this_local;
  
  it._M_node = (_Base_ptr)_frag_src;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
       ::begin(&this->functions);
  while( true ) {
    name.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
         ::end(&this->functions);
    bVar2 = std::operator!=(&local_28,(_Self *)((long)&name.field_2 + 8));
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
             ::operator->(&local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&arrayName.field_2 + 8),&ppVar3->first,";");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
             ::operator->(&local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &ppVar3->first,"[");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = findId(_vert_src,pcVar4);
    iVar1 = it;
    local_a1 = true;
    if (!bVar2) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = findId((string *)iVar1._M_node,pcVar4);
      iVar1 = it;
      local_a1 = true;
      if (!bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_a1 = findId((string *)iVar1._M_node,pcVar4);
      }
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
             ::operator->(&local_28);
    if ((bool)((ppVar3->second).present & 1U) != local_a1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_28);
      (ppVar3->second).present = local_a1;
      this->m_change = true;
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(arrayName.field_2._M_local_buf + 8));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void Uniforms::checkUniforms( const std::string &_vert_src, const std::string &_frag_src ) {
    // Check active native uniforms
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        std::string name = it->first + ";";
        std::string arrayName = it->first + "[";
        bool present = ( findId(_vert_src, name.c_str()) || findId(_frag_src, name.c_str()) || findId(_frag_src, arrayName.c_str()) );
        if ( it->second.present != present ) {
            it->second.present = present;
            m_change = true;
        } 
    }
}